

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxseparate.cpp
# Opt level: O1

int32_t main(int32_t argc,char **argv)

{
  char *__haystack;
  char *pcVar1;
  bool bVar2;
  int32_t iVar3;
  char *pcVar4;
  ogt_vox_scene *_scene;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ogt_vox_model *model;
  char tmp_model_name [64];
  char output_filename [1024];
  ogt_vox_scene output_scene;
  int32_t local_49f0;
  ogt_vox_model *local_49c0;
  ogt_vox_layer local_49b8;
  ogt_vox_instance local_49a8;
  char local_4928 [64];
  ogt_vox_group local_48e8;
  char local_4878 [4];
  undefined1 auStack_4874 [1028];
  ogt_vox_scene local_4470;
  
  if (argc < 2) {
    puts("ERROR: no input files were provided on the command-line");
    puts(
        "voxseparate v1.0 by Justin Paver - source code available here: http://github.com/jpaver/opengametools \n\nThis tool extracts models out of MagicaVoxel .vox files and saves them as individual models within separate .vox files.\n\n usage: voxseparate <input_file.vox> <input_file2.vox> ...\n\n  It is recommended that you provide names for each instance of your model within the .vox files so\n  that output filenames make sense, otherwise output filenames will be auto-generated"
        );
    iVar3 = 3;
  }
  else {
    local_49b8.color.r = '\0';
    local_49b8.color.g = '\0';
    local_49b8.color.b = '\0';
    local_49b8.color.a = '\0';
    local_49b8.hidden = false;
    local_49b8._13_3_ = 0;
    local_49b8.name = "default";
    local_48e8.name = (char *)0x0;
    local_48e8.layer_index = 0;
    local_48e8.hidden = false;
    local_48e8._81_7_ = 0;
    local_48e8.transform_anim.keyframes = (ogt_vox_keyframe_transform *)0x0;
    local_48e8.transform.m12 = 0.0;
    local_48e8.transform.m13 = 0.0;
    local_48e8.transform.m20 = 0.0;
    local_48e8.transform.m21 = 0.0;
    local_48e8.transform_anim.num_keyframes = 0;
    local_48e8.transform_anim.loop = false;
    local_48e8.transform_anim._13_3_ = 0;
    local_48e8.transform.m00 = 1.0;
    local_48e8.transform.m01 = 0.0;
    local_48e8.transform.m02 = 0.0;
    local_48e8.transform.m03 = 0.0;
    local_48e8.transform.m10 = 0.0;
    local_48e8.transform.m11 = 1.0;
    local_48e8.transform.m22 = 1.0;
    local_48e8.transform.m23 = 0.0;
    local_48e8.transform.m30 = 0.0;
    local_48e8.transform.m31 = 0.0;
    local_48e8.transform.m32 = 0.0;
    local_48e8.transform.m33 = 1.0;
    local_48e8.parent_group_index = 0xffffffff;
    uVar9 = 1;
    local_49f0 = 0;
    do {
      __haystack = argv[uVar9];
      pcVar4 = strstr(__haystack,".vox");
      if (pcVar4 == (char *)0x0) {
        bVar2 = false;
        printf("ERROR: input \'%s\' specified does not have .vox extension.\n",__haystack);
        local_49f0 = 4;
      }
      else {
        printf("processing input %s\n");
        _scene = load_vox_scene(__haystack,0);
        bVar2 = _scene != (ogt_vox_scene *)0x0;
        if (_scene == (ogt_vox_scene *)0x0) {
          bVar2 = false;
          printf("ERROR: could not load scene with name \'%s\'\n",__haystack);
          local_49f0 = 5;
        }
        else {
          if (_scene->num_models != 0) {
            uVar10 = 0;
            do {
              local_49c0 = _scene->models[uVar10];
              if (_scene->num_instances == 0) {
                pcVar4 = (char *)0x0;
              }
              else {
                lVar8 = 0;
                uVar7 = 0;
                pcVar5 = (char *)0x0;
                do {
                  pcVar1 = *(char **)((long)&_scene->instances->name + lVar8);
                  pcVar4 = pcVar5;
                  if (((pcVar1 != (char *)0x0) &&
                      (uVar10 == *(uint *)((long)&_scene->instances->model_index + lVar8))) &&
                     (pcVar4 = pcVar1, pcVar5 != (char *)0x0)) {
                    printf("WARNING: model %i has been given name %s but there is also an instance of this model with name %s."
                           ,uVar10 & 0xffffffff,pcVar5);
                    pcVar4 = pcVar5;
                  }
                  uVar7 = uVar7 + 1;
                  lVar8 = lVar8 + 0x78;
                  pcVar5 = pcVar4;
                } while (uVar7 < _scene->num_instances);
              }
              local_4928[0x30] = '\0';
              local_4928[0x31] = '\0';
              local_4928[0x32] = '\0';
              local_4928[0x33] = '\0';
              local_4928[0x34] = '\0';
              local_4928[0x35] = '\0';
              local_4928[0x36] = '\0';
              local_4928[0x37] = '\0';
              local_4928[0x38] = '\0';
              local_4928[0x39] = '\0';
              local_4928[0x3a] = '\0';
              local_4928[0x3b] = '\0';
              local_4928[0x3c] = '\0';
              local_4928[0x3d] = '\0';
              local_4928[0x3e] = '\0';
              local_4928[0x3f] = '\0';
              local_4928[0x20] = '\0';
              local_4928[0x21] = '\0';
              local_4928[0x22] = '\0';
              local_4928[0x23] = '\0';
              local_4928[0x24] = '\0';
              local_4928[0x25] = '\0';
              local_4928[0x26] = '\0';
              local_4928[0x27] = '\0';
              local_4928[0x28] = '\0';
              local_4928[0x29] = '\0';
              local_4928[0x2a] = '\0';
              local_4928[0x2b] = '\0';
              local_4928[0x2c] = '\0';
              local_4928[0x2d] = '\0';
              local_4928[0x2e] = '\0';
              local_4928[0x2f] = '\0';
              local_4928[0x10] = '\0';
              local_4928[0x11] = '\0';
              local_4928[0x12] = '\0';
              local_4928[0x13] = '\0';
              local_4928[0x14] = '\0';
              local_4928[0x15] = '\0';
              local_4928[0x16] = '\0';
              local_4928[0x17] = '\0';
              local_4928[0x18] = '\0';
              local_4928[0x19] = '\0';
              local_4928[0x1a] = '\0';
              local_4928[0x1b] = '\0';
              local_4928[0x1c] = '\0';
              local_4928[0x1d] = '\0';
              local_4928[0x1e] = '\0';
              local_4928[0x1f] = '\0';
              local_4928[0] = '\0';
              local_4928[1] = '\0';
              local_4928[2] = '\0';
              local_4928[3] = '\0';
              local_4928[4] = '\0';
              local_4928[5] = '\0';
              local_4928[6] = '\0';
              local_4928[7] = '\0';
              local_4928[8] = '\0';
              local_4928[9] = '\0';
              local_4928[10] = '\0';
              local_4928[0xb] = '\0';
              local_4928[0xc] = '\0';
              local_4928[0xd] = '\0';
              local_4928[0xe] = '\0';
              local_4928[0xf] = '\0';
              if (pcVar4 == (char *)0x0) {
                pcVar4 = local_4928;
                sprintf(pcVar4,"model%i",uVar10 & 0xffffffff);
              }
              local_49a8.transform_anim.num_keyframes = 0;
              local_49a8.transform_anim.loop = false;
              local_49a8.transform_anim._13_3_ = 0;
              local_49a8.model_anim.keyframes = (ogt_vox_keyframe_model *)0x0;
              local_49a8.group_index = 0;
              local_49a8.hidden = false;
              local_49a8._85_3_ = 0;
              local_49a8.transform_anim.keyframes = (ogt_vox_keyframe_transform *)0x0;
              local_49a8.model_index = 0;
              local_49a8.layer_index = 0;
              local_49a8.name = (char *)0x0;
              local_49a8.model_anim.num_keyframes = 0;
              local_49a8.model_anim.loop = false;
              local_49a8.model_anim._13_3_ = 0;
              local_49a8.transform.m12 = 0.0;
              local_49a8.transform.m13 = 0.0;
              local_49a8.transform.m20 = 0.0;
              local_49a8.transform.m21 = 0.0;
              local_49a8.transform.m00 = 1.0;
              local_49a8.transform.m01 = 0.0;
              local_49a8.transform.m02 = 0.0;
              local_49a8.transform.m03 = 0.0;
              local_49a8.transform.m10 = 0.0;
              local_49a8.transform.m11 = 1.0;
              local_49a8.transform.m22 = 1.0;
              local_49a8.transform.m23 = 0.0;
              local_49a8.transform.m30 = 0.0;
              local_49a8.transform.m31 = 0.0;
              local_49a8.transform.m32 = 0.0;
              local_49a8.transform.m33 = 1.0;
              memset(&local_4470,0,0x4440);
              local_4470.groups = &local_48e8;
              local_4470.instances = &local_49a8;
              local_4470.num_layers = 1;
              local_4470.num_groups = 1;
              local_4470.layers = &local_49b8;
              local_4470.num_models = 1;
              local_4470.num_instances = 1;
              local_4470.models = &local_49c0;
              memcpy(&local_4470.palette,&_scene->palette,0x400);
              strcpy(local_4878,__haystack);
              pcVar5 = strchr(local_4878,0x2e);
              *pcVar5 = '\0';
              sVar6 = strlen(local_4878);
              (local_4878 + sVar6)[0] = '-';
              (local_4878 + sVar6)[1] = '\0';
              strcat(local_4878,pcVar4);
              sVar6 = strlen(local_4878);
              auStack_4874[sVar6] = 0;
              builtin_strncpy(local_4878 + sVar6,".vox",4);
              save_vox_scene(local_4878,&local_4470);
              uVar10 = uVar10 + 1;
            } while (uVar10 < _scene->num_models);
          }
          ogt_vox_destroy_scene(_scene);
        }
      }
      if (!bVar2) {
        return local_49f0;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)argc);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int32_t main(int32_t argc, char** argv) {
    // validate we have at least one input file provided on command-line.
    if (argc <= 1) {
        printf("ERROR: no input files were provided on the command-line\n");
        print_help();
        return 3;
    }

    ogt_vox_layer default_layer = {};
    default_layer.hidden = false;
    default_layer.name = "default";

    ogt_vox_group default_group = {};
    default_group.hidden = false;
    default_group.layer_index = 0;
    default_group.parent_group_index = k_invalid_group_index;
    default_group.transform = ogt_vox_transform_get_identity();

    // process all input files specified
    for (int32_t input_index = 1; input_index < argc; input_index++) {
        const char* input_filename = argv[input_index];
        if (!strstr(input_filename, ".vox")) {
            printf("ERROR: input '%s' specified does not have .vox extension.\n", input_filename);
            return 4;
        }
        printf("processing input %s\n", input_filename);

        // load scene
        const ogt_vox_scene* scene = load_vox_scene(input_filename);
        if (!scene) {
            printf("ERROR: could not load scene with name '%s'\n", input_filename);
            return 5;
        }

        // determine which models we're going to write to the FBX file.
        for (uint32_t model_index = 0; model_index < scene->num_models; model_index++) {
            const ogt_vox_model* model = scene->models[model_index];

            // find the model name by finding a named instance that references it.
            const char* model_name = NULL;
            for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++) {
                if (scene->instances[instance_index].name && scene->instances[instance_index].model_index == model_index) {
                    if (!model_name) {
                        model_name = scene->instances[instance_index].name;
                    }
                    else {
                        // warn if there are multiple instances of the same model with different names causing ambiguity (a .vox author could do this without knowing).
                        printf("WARNING: model %i has been given name %s but there is also an instance of this model with name %s.", model_index, model_name, scene->instances[instance_index].name);
                    }
                }
            }

            // if there is no model name, we either skip the export of this model (if --named-models-only was specified ) or give it an autogenerated name
            char tmp_model_name[64] = {};
            if (!model_name) {
                // otherwise, autogenerate a name for the model based on its index in the vox file.
                model_name = tmp_model_name;
                sprintf_s(tmp_model_name, "model%i", model_index);
            }

            // construct the scene with a single instance referencing this model
            ogt_vox_instance instance = {};
            instance.group_index = 0;   // default_group
            instance.hidden      = false;
            instance.layer_index = 0;   // default_layer
            instance.model_index = 0;
            instance.name        = NULL;
            instance.transform   = ogt_vox_transform_get_identity();

            ogt_vox_scene output_scene = {};
            output_scene.groups        = &default_group;
            output_scene.num_groups    = 1;
            output_scene.instances     = &instance;
            output_scene.num_instances = 1;
            output_scene.instances     = &instance;
            output_scene.num_layers    = 1;
            output_scene.layers        = &default_layer;
            output_scene.num_models    = 1;
            output_scene.models        = &model;
            output_scene.palette       = scene->palette;

            // construct the output filename for this model.
            char output_filename[1024];
            strcpy_s(output_filename, input_filename);
            char* ext = strstr(output_filename, ".");
            *ext = 0;
            strcat_s(output_filename, "-");
            strcat_s(output_filename, model_name);
            strcat_s(output_filename, ".vox");

            save_vox_scene(output_filename, &output_scene);
        }

        ogt_vox_destroy_scene(scene);
    }

    return 0;
}